

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O1

void __thiscall
stackjit::AssemblyImageGenerator::generateImage
          (AssemblyImageGenerator *this,
          vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
          *assemblies,ostream *stream)

{
  pointer pAVar1;
  pointer pFVar2;
  pointer pcVar3;
  long lVar4;
  Assembly *pAVar5;
  pointer pCVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 uVar8;
  vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_> *pvVar9;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *pvVar10;
  string *psVar11;
  iterator iVar12;
  undefined8 uVar13;
  size_t i;
  long lVar14;
  Function *function;
  Function *extraout_RDX;
  Function *function_00;
  Function *extraout_RDX_00;
  unsigned_long value;
  Assembly *pAVar15;
  pointer pCVar16;
  _Alloc_hider this_00;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  unsigned_long value_00;
  pointer pFVar17;
  Assembly *assembly;
  pointer this_02;
  BinaryData data;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  classBodyOffsets;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  funcBodyOffsets;
  undefined1 local_108 [48];
  string local_d8;
  undefined8 local_b8;
  ostream *local_b0;
  undefined1 local_a8 [24];
  size_type sStack_90;
  size_t local_88;
  __node_base_ptr local_80;
  __node_base_ptr p_Stack_78;
  long local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  this_02 = (assemblies->
            super__Vector_base<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (assemblies->
           super__Vector_base<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_108._40_8_ = assemblies;
  local_b0 = stream;
  if (this_02 == pAVar1) {
    value = 0;
    value_00 = 0;
  }
  else {
    value_00 = 0;
    value = 0;
    do {
      pvVar9 = Loader::Assembly::functions(this_02);
      pFVar17 = (pvVar9->
                super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pFVar2 = (pvVar9->
               super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pvVar10 = Loader::Assembly::classes(this_02);
      value_00 = value_00 + ((long)pFVar2 - (long)pFVar17 >> 4) * -0xf0f0f0f0f0f0f0f;
      value = value + ((long)(pvVar10->
                             super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar10->
                             super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
      this_02 = this_02 + 1;
    } while (this_02 != pAVar1);
  }
  anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,value_00);
  anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,value);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pCVar16 = (pointer)(((_Vector_impl *)&((string *)local_108._40_8_)->_M_dataplus)->
                     super__Vector_impl_data)._M_start;
  local_108._24_8_ = ((string *)local_108._40_8_)->_M_string_length;
  if (pCVar16 != (pointer)local_108._24_8_) {
    paVar7 = &local_d8.field_2;
    do {
      local_108._32_8_ = pCVar16;
      pvVar9 = Loader::Assembly::functions((Assembly *)pCVar16);
      pFVar2 = (pvVar9->
               super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pFVar17 = (pvVar9->
                     super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                     )._M_impl.super__Vector_impl_data._M_start; pFVar17 != pFVar2;
          pFVar17 = pFVar17 + 1) {
        generateFunctionDefinition
                  ((AssemblyImageGenerator *)pCVar16,(BinaryData *)local_108,pFVar17);
        Loader::getSignature_abi_cxx11_((string *)(local_108 + 0x30),(Loader *)pFVar17,function);
        local_88 = local_108._8_8_ - local_108._0_8_;
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_a8 + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar7) {
          local_a8._0_8_ = local_d8._M_dataplus._M_p;
        }
        local_a8._20_4_ = local_d8.field_2._M_allocated_capacity._4_4_;
        local_a8._16_4_ = local_d8.field_2._M_allocated_capacity._0_4_;
        local_a8._8_8_ = local_d8._M_string_length;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_allocated_capacity._0_4_ =
             local_d8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_d8._M_dataplus._M_p = (pointer)paVar7;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar7) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        pCVar16 = (pointer)local_108;
        anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,0);
      }
      pCVar16 = (pointer)((((string *)(local_108._32_8_ + 0x38))->field_2)._M_local_buf + 8);
    } while (pCVar16 != (pointer)local_108._24_8_);
  }
  local_a8._0_8_ = &p_Stack_78;
  local_a8._8_8_ = (_Hash_node_base *)0x1;
  local_a8._16_8_ = (_Hash_node_base *)0x0;
  sStack_90 = 0;
  local_88 = CONCAT44(local_88._4_4_,0x3f800000);
  local_80 = (__node_base_ptr)0x0;
  p_Stack_78 = (__node_base_ptr)0x0;
  pAVar15 = (((_Vector_impl *)&((string *)local_108._40_8_)->_M_dataplus)->super__Vector_impl_data).
            _M_start;
  local_108._24_8_ = ((string *)local_108._40_8_)->_M_string_length;
  if (pAVar15 != (Assembly *)local_108._24_8_) {
    do {
      pvVar10 = Loader::Assembly::classes(pAVar15);
      pCVar16 = (pvVar10->
                super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_108._32_8_ =
           (pvVar10->
           super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (pCVar16 != (pointer)local_108._32_8_) {
        do {
          psVar11 = Loader::Class::name_abi_cxx11_(pCVar16);
          anon_unknown_3::addString((BinaryData *)local_108,psVar11);
          psVar11 = Loader::Class::name_abi_cxx11_(pCVar16);
          uVar8 = local_108._8_8_;
          uVar13 = local_108._0_8_;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          pcVar3 = (psVar11->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_108 + 0x30),pcVar3,pcVar3 + psVar11->_M_string_length);
          local_b8 = uVar8 - uVar13;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,0);
          pCVar16 = pCVar16 + 1;
        } while (pCVar16 != (pointer)local_108._32_8_);
      }
      pAVar15 = pAVar15 + 1;
    } while (pAVar15 != (Assembly *)local_108._24_8_);
  }
  pCVar16 = (pointer)(((_Vector_impl *)&((string *)local_108._40_8_)->_M_dataplus)->
                     super__Vector_impl_data)._M_start;
  local_108._24_8_ = ((string *)local_108._40_8_)->_M_string_length;
  if (pCVar16 != (pointer)local_108._24_8_) {
    do {
      local_108._32_8_ = pCVar16;
      pvVar9 = Loader::Assembly::functions((Assembly *)pCVar16);
      pFVar2 = (pvVar9->
               super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      function_00 = extraout_RDX;
      for (pFVar17 = (pvVar9->
                     super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                     )._M_impl.super__Vector_impl_data._M_start; pFVar17 != pFVar2;
          pFVar17 = pFVar17 + 1) {
        Loader::getSignature_abi_cxx11_((string *)(local_108 + 0x30),(Loader *)pFVar17,function_00);
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_68,(string *)(local_108 + 0x30));
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range(anon_var_dwarf_69);
          goto LAB_001153f5;
        }
        lVar4 = *(long *)((long)iVar12.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                ._M_cur + 0x28);
        local_70 = local_108._8_8_ - local_108._0_8_;
        lVar14 = 0;
        do {
          *(char *)(local_108._0_8_ + lVar14 + lVar4) = *(char *)((long)&local_70 + lVar14);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 8);
        this_00._M_p = local_d8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        generateFunctionBody((AssemblyImageGenerator *)this_00._M_p,(BinaryData *)local_108,pFVar17)
        ;
        function_00 = extraout_RDX_00;
      }
      pCVar16 = (pointer)((((string *)(local_108._32_8_ + 0x38))->field_2)._M_local_buf + 8);
    } while (pCVar16 != (pointer)local_108._24_8_);
  }
  pAVar15 = (((_Vector_impl *)&((string *)local_108._40_8_)->_M_dataplus)->super__Vector_impl_data).
            _M_start;
  pAVar5 = (Assembly *)((string *)local_108._40_8_)->_M_string_length;
  if (pAVar15 != pAVar5) {
    do {
      pvVar10 = Loader::Assembly::classes(pAVar15);
      pCVar6 = (pvVar10->
               super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar16 = (pvVar10->
                     super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                     )._M_impl.super__Vector_impl_data._M_start; pCVar16 != pCVar6;
          pCVar16 = pCVar16 + 1) {
        psVar11 = Loader::Class::name_abi_cxx11_(pCVar16);
        this_01 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_a8;
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_a8,psVar11);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_001153f5:
          uVar13 = std::__throw_out_of_range(anon_var_dwarf_69);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_a8);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_68);
          if ((pointer)local_108._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_108._0_8_);
          }
          _Unwind_Resume(uVar13);
        }
        lVar4 = *(long *)((long)iVar12.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                ._M_cur + 0x28);
        local_d8._M_dataplus._M_p = (pointer)(local_108._8_8_ + -local_108._0_8_);
        lVar14 = 0;
        do {
          *(undefined1 *)(local_108._0_8_ + lVar14 + lVar4) = local_108[lVar14 + 0x30];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 8);
        generateClassBody((AssemblyImageGenerator *)this_01,(BinaryData *)local_108,pCVar16);
      }
      pAVar15 = pAVar15 + 1;
    } while (pAVar15 != pAVar5);
  }
  std::ostream::write((char *)local_b0,local_108._0_8_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_a8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_);
  }
  return;
}

Assistant:

void AssemblyImageGenerator::generateImage(std::vector<Loader::Assembly>& assemblies, std::ostream& stream) {
		BinaryData data;

		//Compute the number of functions & classes
		std::size_t numFuncs = 0;
		std::size_t numClasses = 0;
		for (auto& assembly : assemblies) {
			numFuncs += assembly.functions().size();
			numClasses += assembly.classes().size();
		}

		//Header
		addData(data, numFuncs);
		addData(data, numClasses);

		//Functions definitions
		std::unordered_map<std::string, std::size_t> funcBodyOffsets;

		for (auto& assembly : assemblies) {
			for (auto& func : assembly.functions()) {
				generateFunctionDefinition(data, func);
				funcBodyOffsets.insert({ Loader::getSignature(func), data.size() });
				addData<std::size_t>(data, 0);
			}
		}

		//Class definitions
		std::unordered_map<std::string, std::size_t> classBodyOffsets;

		for (auto& assembly : assemblies) {
			for (auto& classDef : assembly.classes()) {
				generateClassDefinition(data, classDef);
				classBodyOffsets.insert({ classDef.name(), data.size() });
				addData<std::size_t>(data, 0);
			}
		}

		//Functions bodies
		for (auto& assembly : assemblies) {
			for (auto& func : assembly.functions()) {
				//Patch the offset
				setData<std::size_t>(data, funcBodyOffsets.at(Loader::getSignature(func)), data.size());
				generateFunctionBody(data, func);
			}
		}

		//Class bodies
		for (auto& assembly : assemblies) {
			for (auto& classDef : assembly.classes()) {
				//Patch the offset
				setData<std::size_t>(data, classBodyOffsets.at(classDef.name()), data.size());
				generateClassBody(data, classDef);
			}
		}

		//Write to the stream
		stream.write(data.data(), data.size());
	}